

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O3

void __thiscall MlNeuron::prepareNextState(MlNeuron *this)

{
  double dVar1;
  bool bVar2;
  
  DifferentialEquation::prepareNextState(&this->mlneuronMembrane);
  bVar2 = (this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.
          stochNextStateIsPrepared;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextStateIsPrepared = bVar2;
  dVar1 = (this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.stochNextValue;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextValue = dVar1;
  if (bVar2 == true) {
    (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue =
         this->mlneuronTheta <= dVar1 && dVar1 != this->mlneuronTheta;
  }
  return;
}

Assistant:

void MlNeuron::prepareNextState()
{
	// create next value of differential equation
	mlneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = mlneuronMembrane.isNextStatePrepared();
	stochNextValue = mlneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (stochNextValue > mlneuronTheta)
			eventNextValue = true;
		else 
			eventNextValue = false;
	}
}